

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O0

void p2sc_free_iofile(p2sc_iofile_t *f)

{
  long *in_RDI;
  
  if (in_RDI != (long *)0x0) {
    if (*in_RDI != 0) {
      g_io_channel_unref(*in_RDI);
    }
    g_free(in_RDI[1]);
    memset(in_RDI,0,0x18);
    g_free(in_RDI);
  }
  return;
}

Assistant:

void p2sc_free_iofile(p2sc_iofile_t *f) {
    if (f) {
        if (f->io)
            g_io_channel_unref(f->io);
        g_free(f->name);
        memset(f, 0, sizeof *f);
        g_free(f);
    }
}